

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t add_pattern_wcs(archive_match *a,match_list *list,wchar_t *pattern)

{
  match *pmVar1;
  size_t sVar2;
  size_t len;
  wchar_t wVar3;
  
  pmVar1 = (match *)calloc(1,0x78);
  if (pmVar1 == (match *)0x0) {
    archive_set_error(&a->archive,0xc,"No memory");
    (a->archive).state = 0x8000;
    wVar3 = L'\xffffffe2';
  }
  else {
    sVar2 = wcslen(pattern);
    wVar3 = L'\0';
    if (sVar2 == 0) {
      len = 0;
    }
    else {
      len = sVar2 - (pattern[sVar2 - 1] == L'/');
    }
    archive_mstring_copy_wcs_len(&pmVar1->pattern,pattern,len);
    *list->last = pmVar1;
    list->last = (match **)pmVar1;
    list->count = list->count + L'\x01';
    list->unmatched_count = list->unmatched_count + L'\x01';
    *(byte *)&a->setflag = (byte)a->setflag | 1;
  }
  return wVar3;
}

Assistant:

static int
add_pattern_wcs(struct archive_match *a, struct match_list *list,
    const wchar_t *pattern)
{
	struct match *match;
	size_t len;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	/* Both "foo/" and "foo" should match "foo/bar". */
	len = wcslen(pattern);
	if (len && pattern[len - 1] == L'/')
		--len;
	archive_mstring_copy_wcs_len(&(match->pattern), pattern, len);
	match_list_add(list, match);
	a->setflag |= PATTERN_IS_SET;
	return (ARCHIVE_OK);
}